

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opcodes.c
# Opt level: O0

int Instructions(int loc)

{
  int iVar1;
  int local_2c;
  int local_28;
  int mid;
  int upper;
  int lower;
  char *j;
  char *i;
  int loc_local;
  
  if (optabsize == 0) {
    while (MnemTab[optabsize].Mnem[0] != '\0') {
      optabsize = optabsize + 1;
    }
    oplimits[0] = 0;
    oplimits[0x1a] = optabsize;
    local_2c = 0;
    for (mid = 0; mid < optabsize; mid = mid + 1) {
      iVar1 = MnemTab[mid].Mnem[0] + -0x40;
      if ((iVar1 != local_2c) && (0 < iVar1)) {
        while (local_2c = local_2c + 1, local_2c < iVar1) {
          oplimits[local_2c] = mid;
        }
        oplimits[local_2c] = mid;
      }
    }
    while (local_2c = local_2c + 1, local_2c < 0x1a) {
      oplimits[local_2c] = optabsize;
    }
  }
  iVar1 = OpCode[0] + -0x40;
  if (iVar1 < 0) {
    mid = 0;
    local_28 = oplimits[1];
    iVar1 = local_28;
  }
  else if (iVar1 < 0x1b) {
    mid = oplimits[iVar1];
    iVar1 = oplimits[OpCode[0] + -0x3f];
  }
  else {
    local_28 = 0;
    mid = 0;
    iVar1 = local_28;
  }
  while( true ) {
    do {
      local_28 = iVar1;
      if (local_28 <= mid) {
        Op = 0;
        AdrModeB = 0;
        AdrModeA = 0;
        Dir = 0;
        return 0;
      }
      iVar1 = (mid + local_28) / 2;
      _upper = MnemTab + iVar1;
      for (j = OpCode; (*j == _upper->Mnem[0] && (*j != '\0')); j = j + 1) {
        _upper = (OpTab *)(_upper->Mnem + 1);
      }
    } while (*j < _upper->Mnem[0]);
    if (*j <= _upper->Mnem[0]) break;
    mid = iVar1 + 1;
    iVar1 = local_28;
  }
  if (MnemTab[iVar1].AMA != 0xffff) {
    Dir = 0;
    AdrModeA = MnemTab[iVar1].AMA;
    AdrModeB = MnemTab[iVar1].AMB;
    Op = MnemTab[iVar1].OpBits;
    return 1;
  }
  Dir = MnemTab[iVar1].AMB;
  AdrModeA = 0;
  AdrModeB = 0;
  Op = 0;
  return 1;
}

Assistant:

int Instructions(int loc)
/* Looks up opcode and addressing mode bit patterns
 If the opcode corresponds to an executable instruction,
 returns TRUE with the following fields set up:
 Op       - operation code bits
 AdrModeA - addressing mode bits
 AdrModeB - more addressing mode bits
 Dir      - None
 If the opcode corresponds to a directive (AdrModeA in the table
 is 0xFFFF), returns TRUE with the following fields set up:
 Op       - 0
 AdrModeA - 0
 AdrModeB - 0
 Dir      - the appropriate directive value
 If not found, returns FALSE with all the above fields set to zero.

 NOTE: The binary search doesn't use strcmp because this function
 returns incorrect values under MS-DOS Lattice 2.12.		      */
{

// For the love of god. strcmp is slower than C implementation. -- Alkis
//#define USESTRCMP
#ifdef USESTRCMP
	register int cmp;
#else
	register char *i, *j;
#endif
	register int lower, upper, mid; /* Binary search controls */

	if (optabsize == 0) { /* Determine size of opcode table. */
		while (MnemTab[optabsize].Mnem[0])
			optabsize++;
		oplimits[0] = 0;
		oplimits['Z' - 'A' + 1] = optabsize;
		mid = 0;
		for (lower = 0; lower < optabsize; lower++) {
			upper = (unsigned int) MnemTab[lower].Mnem[0] - 'A' + 1;
			if (upper != mid) {
				if (upper > 0) { /* Start of the next letter */
					mid++;
					while (mid < upper)
						oplimits[mid++] = lower;
					oplimits[mid] = lower;
				}
			}
		}
		mid++;
		while (mid < 'Z' - 'A' + 1) {
			oplimits[mid++] = optabsize; /* In case we didn't get to Z */
		}
	}

	mid = (unsigned int) OpCode[0] - 'A' + 1;
	if (mid < 0) { /* This catches stuff like "=". */
		lower = 0;
		upper = oplimits[1];
	} else if (mid > 'Z' - 'A' + 1) {
		lower = upper = 0; /* Reject this one. */
	} else {
		lower = oplimits[mid++];
		upper = oplimits[mid];
	}
	while (lower < upper) {
		mid = (lower + upper) / 2; /* Search the opcode table. */
#ifdef USESTRCMP
		cmp = strcmp(OpCode,MnemTab[mid].Mnem);
		if (cmp<0) {
			upper = mid; /* Search lower half of table. */
		} else if (cmp>0) {
			lower = mid + 1; /* Search upper half of table. */
#else
		for (i = OpCode, j = MnemTab[mid].Mnem; *i == *j; i++, j++)
			if (*i == '\0')
				break; /* Find the first non-match. */
		if (*i < *j) {
			upper = mid; /* Search lower half of table. */
		} else if (*i > *j) {
			lower = mid + 1; /* Search upper half of table. */
#endif
		}else if (MnemTab[mid].AMA != 0xFFFF) { /* Found it. */
			Op = MnemTab[mid].OpBits; /* Executable instruction */
			AdrModeA = MnemTab[mid].AMA;
			AdrModeB = MnemTab[mid].AMB;
			Dir = None;
			return (TRUE);
		} else {
			Op = AdrModeA = AdrModeB = 0; /* Directive */
			Dir = MnemTab[mid].AMB;
			return (TRUE);
		}
	}
	Op = AdrModeA = AdrModeB = Dir = 0;
	return (FALSE); /* We didn't find it. */
}